

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupFlopClass(Gia_Man_t *p,int iClass)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_34;
  int local_30;
  int Counter2;
  int Counter1;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int iClass_local;
  Gia_Man_t *p_local;
  
  local_30 = 0;
  local_34 = 0;
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFlopClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x4d2,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  Counter2 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar5 = false;
    if (Counter2 < iVar1) {
      _Counter1 = Gia_ManCi(p,Counter2);
      bVar5 = _Counter1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _Counter1->Value = uVar2;
    Counter2 = Counter2 + 1;
  }
  Counter2 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (Counter2 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _Counter1 = Gia_ManCi(p,iVar1 + Counter2);
      bVar5 = _Counter1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Vec_IntEntry(p->vFlopClasses,Counter2);
    if (iVar1 != iClass) {
      uVar2 = Gia_ManAppendCi(p_00);
      _Counter1->Value = uVar2;
    }
    Counter2 = Counter2 + 1;
  }
  Counter2 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (Counter2 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _Counter1 = Gia_ManCi(p,iVar1 + Counter2);
      bVar5 = _Counter1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Vec_IntEntry(p->vFlopClasses,Counter2);
    if (iVar1 == iClass) {
      uVar2 = Gia_ManAppendCi(p_00);
      _Counter1->Value = uVar2;
      local_30 = local_30 + 1;
    }
    Counter2 = Counter2 + 1;
  }
  Counter2 = 0;
  while( true ) {
    bVar5 = false;
    if (Counter2 < p->nObjs) {
      _Counter1 = Gia_ManObj(p,Counter2);
      bVar5 = _Counter1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_Counter1);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_Counter1);
      iLit1 = Gia_ObjFanin1Copy(_Counter1);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      _Counter1->Value = uVar2;
    }
    Counter2 = Counter2 + 1;
  }
  Counter2 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar5 = false;
    if (Counter2 < iVar1) {
      _Counter1 = Gia_ManCo(p,Counter2);
      bVar5 = _Counter1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(_Counter1);
    Gia_ManAppendCo(p_00,iVar1);
    Counter2 = Counter2 + 1;
  }
  Counter2 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (Counter2 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _Counter1 = Gia_ManCo(p,iVar1 + Counter2);
      bVar5 = _Counter1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Vec_IntEntry(p->vFlopClasses,Counter2);
    if (iVar1 != iClass) {
      iVar1 = Gia_ObjFanin0Copy(_Counter1);
      Gia_ManAppendCo(p_00,iVar1);
    }
    Counter2 = Counter2 + 1;
  }
  Counter2 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (Counter2 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _Counter1 = Gia_ManCo(p,iVar1 + Counter2);
      bVar5 = _Counter1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Vec_IntEntry(p->vFlopClasses,Counter2);
    if (iVar1 == iClass) {
      iVar1 = Gia_ObjFanin0Copy(_Counter1);
      Gia_ManAppendCo(p_00,iVar1);
      local_34 = local_34 + 1;
    }
    Counter2 = Counter2 + 1;
  }
  if (local_30 != local_34) {
    __assert_fail("Counter1 == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x4ea,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
  }
  Gia_ManSetRegNum(p_00,local_30);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFlopClass( Gia_Man_t * p, int iClass )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i, Counter1 = 0, Counter2 = 0;
    assert( p->vFlopClasses != NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            pObj->Value = Gia_ManAppendCi( pNew ), Counter1++;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ), Counter2++;
    assert( Counter1 == Counter2 );
    Gia_ManSetRegNum( pNew, Counter1 );
    return pNew;
}